

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  ulong value;
  LogMessage *this_00;
  LogMessage *other;
  int in_EDX;
  LogMessage *in_RDI;
  int unaff_retaddr;
  uint8 *in_stack_00000008;
  MessageLite *in_stack_00000010;
  uint8 *start;
  size_t byte_size;
  string *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel level;
  string local_80 [88];
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  value = (**(code **)(*(long *)in_RDI + 0x48))();
  if (value < 0x80000000) {
    if ((ulong)(long)in_EDX < value) {
      local_1 = false;
    }
    else {
      SerializeToArrayImpl(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_1 = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (in_RDI,level,(char *)in_stack_ffffffffffffff50,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    (**(code **)(*(long *)in_RDI + 0x10))(local_80);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),value);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    std::__cxx11::string::~string(local_80);
    internal::LogMessage::~LogMessage((LogMessage *)0x419375);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}